

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

uint __thiscall jpgd::jpeg_decoder::get_bits(jpeg_decoder *this,int num_bits)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (num_bits == 0) {
    uVar5 = 0;
  }
  else {
    uVar1 = this->m_bit_buf;
    uVar5 = uVar1 >> (-(byte)num_bits & 0x1f);
    iVar2 = this->m_bits_left;
    this->m_bits_left = iVar2 - num_bits;
    if (iVar2 - num_bits == 0 || iVar2 < num_bits) {
      this->m_bit_buf = uVar1 << ((byte)iVar2 & 0x1f);
      uVar3 = get_char(this);
      uVar4 = get_char(this);
      iVar2 = this->m_bits_left;
      this->m_bit_buf =
           (uVar3 << 8 | uVar4 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10) <<
           (-(char)iVar2 & 0x1fU);
      this->m_bits_left = iVar2 + 0x10;
      if (iVar2 < -0x10) {
        __assert_fail("m_bits_left >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x1dc,"uint jpgd::jpeg_decoder::get_bits(int)");
      }
    }
    else {
      this->m_bit_buf = uVar1 << ((byte)num_bits & 0x1f);
    }
  }
  return uVar5;
}

Assistant:

inline uint jpeg_decoder::get_bits(int num_bits)
	{
		if (!num_bits)
			return 0;

		uint i = m_bit_buf >> (32 - num_bits);

		if ((m_bits_left -= num_bits) <= 0)
		{
			m_bit_buf <<= (num_bits += m_bits_left);

			uint c1 = get_char();
			uint c2 = get_char();
			m_bit_buf = (m_bit_buf & 0xFFFF0000) | (c1 << 8) | c2;

			m_bit_buf <<= -m_bits_left;

			m_bits_left += 16;

			assert(m_bits_left >= 0);
		}
		else
			m_bit_buf <<= num_bits;

		return i;
	}